

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr
          (ExprVisitorDelegate *this,ReturnCallIndirectExpr *expr)

{
  WatWriter *pWVar1;
  char *local_50;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo((Opcode *)&Opcode::ReturnCallIndirect_Opcode);
  WritePuts(pWVar1,local_50,Space);
  pWVar1 = this->writer_;
  WritePuts(pWVar1,"(",None);
  WritePuts(pWVar1,"type",Space);
  pWVar1->indent_ = pWVar1->indent_ + 2;
  WriteVar(this->writer_,&(expr->decl).type_var,Space);
  WriteClose(this->writer_,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr(
    ReturnCallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::ReturnCallIndirect_Opcode.GetName());
  writer_->WriteOpenSpace("type");
  writer_->WriteVar(expr->decl.type_var, NextChar::Space);
  writer_->WriteCloseNewline();
  return Result::Ok;
}